

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

MPLSStreamInfo * __thiscall
MPLSParser::getStreamByPID(MPLSStreamInfo *__return_storage_ptr__,MPLSParser *this,int pid)

{
  pointer other;
  
  other = (this->m_streamInfo).super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
          _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (other == (this->m_streamInfo).
                 super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->super_M2TSStreamInfo).streamPID = 0;
      (__return_storage_ptr__->super_M2TSStreamInfo).stream_coding_type = RESERVED;
      (__return_storage_ptr__->super_M2TSStreamInfo).video_format = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).frame_rate_index = '\x03';
      (__return_storage_ptr__->super_M2TSStreamInfo).number_of_offset_sequences = 0;
      (__return_storage_ptr__->super_M2TSStreamInfo).width = 0;
      (__return_storage_ptr__->super_M2TSStreamInfo).height = 0;
      (__return_storage_ptr__->super_M2TSStreamInfo).HDR = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super_M2TSStreamInfo).height + 1) = 0;
      (__return_storage_ptr__->super_M2TSStreamInfo).audio_presentation_type = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).sampling_frequency_index = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).character_code = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).language_code[0] = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).language_code[1] = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).language_code[2] = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).language_code[3] = '\0';
      (__return_storage_ptr__->super_M2TSStreamInfo).isSecondary = false;
      (__return_storage_ptr__->super_M2TSStreamInfo).m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super_M2TSStreamInfo).m_index.
      super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_M2TSStreamInfo).m_index.
               super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_M2TSStreamInfo).m_index.
               super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
      __return_storage_ptr__->offsetId = 0xff;
      __return_storage_ptr__->isSSPG = false;
      __return_storage_ptr__->SS_PG_offset_sequence_id = 0xff;
      __return_storage_ptr__->leftEye = (MPLSStreamInfo *)0x0;
      __return_storage_ptr__->rightEye = (MPLSStreamInfo *)0x0;
      (__return_storage_ptr__->pipParams).scaleIndex = 1;
      (__return_storage_ptr__->pipParams).corner = TopLeft;
      (__return_storage_ptr__->pipParams).hOffset = 0;
      (__return_storage_ptr__->pipParams).vOffset = 0;
      (__return_storage_ptr__->pipParams).lumma = 3;
      return __return_storage_ptr__;
    }
    if ((other->super_M2TSStreamInfo).streamPID == pid) break;
    other = other + 1;
  }
  MPLSStreamInfo::MPLSStreamInfo(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

MPLSStreamInfo MPLSParser::getStreamByPID(const int pid) const
{
    for (auto& i : m_streamInfo)
    {
        if (i.streamPID == pid)
            return i;
    }
    return {};
}